

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O0

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::PathAt(CASC_FILE_TREE *this,char *szBuffer,size_t cchBuffer,size_t nItemIndex)

{
  PCASC_FILE_NODE pFileNode_00;
  size_t sVar1;
  size_t nLength;
  PCASC_FILE_NODE pFileNode;
  size_t nItemIndex_local;
  size_t cchBuffer_local;
  char *szBuffer_local;
  CASC_FILE_TREE *this_local;
  
  *szBuffer = '\0';
  pFileNode_00 = (PCASC_FILE_NODE)CASC_ARRAY::ItemAt(&this->FileTable,nItemIndex);
  if ((pFileNode_00 != (PCASC_FILE_NODE)0x0) && (pFileNode_00->NameLength != 0)) {
    sVar1 = MakePath(this,pFileNode_00,szBuffer,cchBuffer);
    szBuffer[sVar1] = '\0';
  }
  return pFileNode_00;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::PathAt(char * szBuffer, size_t cchBuffer, size_t nItemIndex)
{
    PCASC_FILE_NODE pFileNode = NULL;
    size_t nLength;

    // Pre-set the buffer with zero
    szBuffer[0] = 0;

    // Query the item
    pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(nItemIndex);
    if(pFileNode != NULL && pFileNode->NameLength != 0)
    {
        // Construct the full path
        nLength = MakePath(pFileNode, szBuffer, cchBuffer);
        szBuffer[nLength] = 0;
    }
    
    return pFileNode;
}